

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_color_quantize.cpp
# Opt level: O1

uint8_t pack_color_endpoints
                  (vfloat4 color0,vfloat4 color1,vfloat4 rgbs_color,vfloat4 rgbo_color,int format,
                  uint8_t *output,quant_method quant_level)

{
  __m128i alVar1;
  uint8_t i;
  bool bVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  uint *puVar7;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint8_t uVar11;
  uint uVar12;
  byte bVar13;
  ulong uVar14;
  byte bVar15;
  uint uVar16;
  vint4 *in_R8;
  long lVar17;
  uint uVar18;
  vint4 *in_R9;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  int iVar63;
  int iVar68;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [64];
  float fVar69;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  vfloat4 color0_00;
  vfloat4 color0_01;
  vfloat4 color0_02;
  vfloat4 color;
  vfloat4 color_00;
  vfloat4 color0_03;
  vfloat4 color0_04;
  vfloat4 color0_05;
  vfloat4 color0_06;
  vfloat4 color0_07;
  vfloat4 color0_08;
  vfloat4 color0_09;
  vfloat4 color0_10;
  vfloat4 color0_11;
  vfloat4 color0_12;
  vfloat4 color1_00;
  vfloat4 color1_01;
  vfloat4 color1_02;
  vfloat4 color1_03;
  vfloat4 color1_04;
  vfloat4 color1_05;
  vfloat4 color1_06;
  vfloat4 color1_07;
  vfloat4 color1_08;
  vint4 input0;
  vint4 input0_00;
  vint4 input0_01;
  vint4 input0_02;
  vint4 input0_03;
  vint4 input0_04;
  vint4 input0_05;
  vint4 input0_06;
  vint4 input1;
  vint4 input1_00;
  vint4 input1_01;
  vint4 input1_02;
  vint4 input1_03;
  vint4 input1_04;
  vint4 input1_05;
  vint4 input1_06;
  vint4 color1_out2;
  vint4 color0_unpack;
  vint4 color0_out;
  vint4 color1_out;
  vint4 color1_unpack_1;
  vint4 color0_unpack_1;
  vint4 local_c8;
  vint4 local_b8;
  undefined1 local_a8 [12];
  float fStack_9c;
  undefined1 local_98 [16];
  vint4 local_88;
  uint8_t *local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [2] [16];
  undefined1 auVar70 [16];
  
  auVar67._8_56_ = color1._16_56_;
  auVar67._0_8_ = color1.m._8_8_;
  auVar62._8_56_ = color1._8_56_;
  auVar62._0_8_ = color1.m._0_8_;
  auVar53._8_56_ = color0._16_56_;
  auVar53._0_8_ = color0.m._8_8_;
  auVar45._8_56_ = color0._8_56_;
  auVar45._0_8_ = color0.m._0_8_;
  uVar18 = quant_level - QUANT_6;
  if (0x10 < uVar18) {
    __assert_fail("QUANT_6 <= quant_level && quant_level <= QUANT_256",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_color_quantize.cpp"
                  ,0x77e,
                  "uint8_t pack_color_endpoints(vfloat4, vfloat4, vfloat4, vfloat4, int, uint8_t *, quant_method)"
                 );
  }
  uVar11 = '\0';
  if (0xf < (uint)format) {
    return '\0';
  }
  auVar48 = vmaxps_avx(auVar45._0_16_,ZEXT816(0) << 0x40);
  auVar22._8_4_ = 0x477fff00;
  auVar22._0_8_ = 0x477fff00477fff00;
  auVar22._12_4_ = 0x477fff00;
  auVar55 = vminps_avx(auVar48,auVar22);
  auVar48 = vmaxps_avx(auVar53._0_16_,ZEXT816(0) << 0x40);
  auVar48 = vminps_avx(auVar48,auVar22);
  fVar73 = auVar55._0_4_ * 0.0038910506;
  fVar74 = auVar55._4_4_ * 0.0038910506;
  fVar75 = auVar55._12_4_ * 0.0038910506;
  auVar43 = CONCAT412(fVar75,CONCAT48(auVar55._8_4_ * 0.0038910506,CONCAT44(fVar74,fVar73)));
  fVar69 = auVar48._0_4_ * 0.0038910506;
  fVar71 = auVar48._4_4_ * 0.0038910506;
  fVar72 = auVar48._12_4_ * 0.0038910506;
  auVar70 = CONCAT412(fVar72,CONCAT48(auVar48._8_4_ * 0.0038910506,CONCAT44(fVar71,fVar69)));
  puVar7 = &switchD_0027a596::switchdataD_00338514;
  color0_00.m._8_8_ = auVar48._0_8_;
  auVar56 = auVar67._0_16_;
  color0_00.m._0_8_ = auVar55._0_8_;
  switch(format) {
  case 0:
    auVar48 = vhaddps_avx(auVar43,auVar43);
    auVar55 = vshufpd_avx(auVar43,auVar43,1);
    fVar69 = (auVar55._0_4_ + auVar48._0_4_) * 0.33333334;
    auVar48 = vhaddps_avx(auVar70,auVar70);
    auVar55 = vshufpd_avx(auVar70,auVar70,1);
    fVar71 = (auVar55._0_4_ + auVar48._0_4_) * 0.33333334;
    fVar72 = (fVar69 + fVar71) * 0.5;
    fVar73 = fVar72;
    if (fVar69 <= fVar71) {
      fVar73 = fVar71;
    }
    auVar48 = vcmpss_avx(ZEXT416((uint)fVar71),ZEXT416((uint)fVar69),1);
    auVar48 = vblendvps_avx(ZEXT416((uint)fVar69),ZEXT416((uint)fVar72),auVar48);
    fVar69 = auVar48._0_4_ + 0.5;
    auVar55 = vcvtdq2ps_avx(ZEXT416((uint)(int)fVar69));
    *output = color_unquant_to_uquant_tables[uVar18]
              [(int)((uint)(-0.1 <= auVar48._0_4_ - auVar55._0_4_) + (int)fVar69 * 2)];
    auVar48 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar73 + 0.5)));
    output[1] = color_unquant_to_uquant_tables[uVar18]
                [(int)((uint)(-0.1 <= fVar73 - auVar48._0_4_) + (int)(fVar73 + 0.5) * 2)];
    uVar11 = '\0';
    break;
  case 2:
  case 3:
    auVar22 = vshufpd_avx(auVar55,auVar55,1);
    auVar22 = vinsertps_avx(auVar22,auVar48,0x9c);
    auVar48 = vhaddps_avx(auVar55,auVar48);
    auVar48 = vshufps_avx(auVar48,auVar48,0xe8);
    auVar23._0_4_ = (auVar22._0_4_ + auVar48._0_4_) * 0.33333334;
    auVar23._4_4_ = (auVar22._4_4_ + auVar48._4_4_) * 0.33333334;
    auVar23._8_4_ = (auVar22._8_4_ + auVar48._8_4_) * 0.33333334;
    auVar23._12_4_ = (auVar22._12_4_ + auVar48._12_4_) * 0.33333334;
    auVar48 = vmovshdup_avx(auVar23);
    bVar2 = auVar48._0_4_ < auVar23._0_4_;
    fVar69 = (auVar23._0_4_ + auVar48._0_4_) * 0.5;
    auVar54[1] = bVar2;
    auVar54[0] = bVar2;
    auVar54[2] = bVar2;
    auVar54[3] = bVar2;
    auVar54[4] = bVar2;
    auVar54[5] = bVar2;
    auVar54[6] = bVar2;
    auVar54[7] = bVar2;
    auVar54[8] = bVar2;
    auVar54[9] = bVar2;
    auVar54[10] = bVar2;
    auVar54[0xb] = bVar2;
    auVar54[0xc] = bVar2;
    auVar54[0xd] = bVar2;
    auVar54[0xe] = bVar2;
    auVar54[0xf] = bVar2;
    auVar55 = vpslld_avx(auVar54,0x1f);
    auVar48._4_4_ = fVar69;
    auVar48._0_4_ = fVar69;
    auVar48._8_4_ = fVar69;
    auVar48._12_4_ = fVar69;
    auVar48 = vblendvps_avx(auVar23,auVar48,auVar55);
    auVar24._0_4_ = (int)(auVar48._0_4_ + 0.5);
    auVar24._4_4_ = (int)(auVar48._4_4_ + 0.5);
    auVar24._8_4_ = (int)(auVar48._8_4_ + 0.5);
    auVar24._12_4_ = (int)(auVar48._12_4_ + 0.5);
    if (auVar24._4_4_ - auVar24._0_4_ < 0x801) {
      uVar8 = auVar24._0_4_ + 0x10 >> 5;
      uVar12 = 0;
      if ((int)uVar8 < 1) {
        uVar8 = uVar12;
      }
      if (0x7fe < (int)uVar8) {
        uVar8 = 0x7ff;
      }
      uVar14 = (ulong)uVar18;
      uVar11 = color_unquant_to_uquant_tables[uVar14][uVar8 * 2 + 1 & 0xff];
      if (-1 < (char)uVar11) {
        uVar20 = auVar24._4_4_ + 0x10 >> 5;
        if ((int)uVar20 < 1) {
          uVar20 = uVar12;
        }
        if (0x7fe < (int)uVar20) {
          uVar20 = 0x7ff;
        }
        uVar20 = uVar20 - (uVar8 & 0x780 | (int)(char)uVar11);
        if ((uVar20 < 0x10) &&
           (uVar8 = uVar8 >> 3 & 0xf0,
           bVar5 = *(byte *)(uVar14 * 0x200 + 0x334371 + (ulong)(uVar20 | uVar8) * 2),
           uVar8 == (bVar5 & 0xfffffff0))) {
          *output = uVar11;
          output[1] = bVar5;
          return '\x03';
        }
      }
      uVar8 = auVar24._0_4_ + 0x20 >> 6;
      if (0 < (int)uVar8) {
        uVar12 = uVar8;
      }
      if (0x3fe < (int)uVar12) {
        uVar12 = 0x3ff;
      }
      bVar5 = color_unquant_to_uquant_tables[uVar14][uVar12 * 2 & 0x1ff | 0x101];
      if ((char)bVar5 < '\0') {
        iVar63 = auVar24._4_4_ + 0x20 >> 6;
        iVar6 = 0;
        if (0 < iVar63) {
          iVar6 = iVar63;
        }
        if (0x3fe < iVar6) {
          iVar6 = 0x3ff;
        }
        uVar8 = iVar6 - (bVar5 & 0x7f | uVar12 & 0x380);
        if ((uVar8 < 0x20) &&
           (uVar12 = uVar12 >> 2 & 0xe0,
           bVar4 = *(byte *)(uVar14 * 0x200 + 0x334371 + (ulong)(uVar8 | uVar12) * 2),
           uVar12 == (bVar4 & 0xffffffe0))) {
          *output = bVar5;
          output[1] = bVar4;
          return '\x03';
        }
      }
    }
    auVar47._8_4_ = 0x80;
    auVar47._0_8_ = 0x8000000080;
    auVar47._12_4_ = 0x80;
    auVar48 = vpaddd_avx(auVar24,auVar47);
    auVar48 = vpsrad_avx(auVar48,8);
    auVar48 = vpmaxsd_avx(auVar48,(undefined1  [16])0x0);
    auVar65._8_4_ = 0xff;
    auVar65._0_8_ = 0xff000000ff;
    auVar65._12_4_ = 0xff;
    auVar55 = vpminsd_avx(auVar48,auVar65);
    auVar48 = vpslld_avx(auVar55,8);
    auVar22 = vpsubd_avx(auVar48,auVar24);
    auVar48 = vpinsrd_avx(auVar24,auVar24._4_4_ + 0x100,1);
    auVar56 = vpmulld_avx(auVar22,auVar22);
    auVar48 = vpsrad_avx(auVar48,8);
    auVar48 = vpmaxsd_avx(auVar48,(undefined1  [16])0x0);
    auVar22 = vpminsd_avx(auVar48,auVar65);
    auVar48 = vpslld_avx(auVar22,8);
    auVar48 = vpsubd_avx(auVar48,auVar24);
    auVar48 = vpaddd_avx(auVar48,_DAT_003384c0);
    auVar48 = vpmulld_avx(auVar48,auVar48);
    auVar48 = vphaddd_avx(auVar56,auVar48);
    bVar2 = auVar48._0_4_ < auVar48._8_4_;
    uVar8 = auVar22._4_4_;
    if (bVar2) {
      uVar8 = auVar55._0_4_;
    }
    uVar12 = auVar22._0_4_;
    if (bVar2) {
      uVar12 = auVar55._4_4_;
    }
    *output = *(uint8_t *)((ulong)uVar18 * 0x200 + 0x334371 + (ulong)uVar8 * 2);
    output[1] = *(uint8_t *)((ulong)uVar18 * 0x200 + 0x334371 + (ulong)uVar12 * 2);
    uVar11 = '\x02';
    break;
  case 4:
    if ((int)quant_level < 0x13) {
      auVar48 = vhaddps_avx(auVar43,auVar43);
      auVar22 = vshufpd_avx(auVar43,auVar43,1);
      auVar55 = vhaddps_avx(auVar70,auVar70);
      auVar56 = vshufpd_avx(auVar70,auVar70,1);
      uVar8 = (uint)((auVar22._0_4_ + auVar48._0_4_) * 0.33333334 + 0.5);
      lVar3 = (ulong)uVar18 * 0x200;
      bVar5 = *(byte *)(lVar3 + 0x334371 + (ulong)((uVar8 & 0x7f) << 2));
      uVar8 = uVar8 * 2 & 0x100;
      iVar6 = uVar8 + bVar5;
      uVar12 = (int)((auVar56._0_4_ + auVar55._0_4_) * 0.33333334 + 0.5) * 2 - iVar6;
      if (0xffffff7f < uVar12 - 0x40) {
        auVar48 = vshufps_avx(auVar43,auVar43,0xff);
        auVar55 = vshufps_avx(auVar70,auVar70,0xff);
        uVar20 = (uint)(auVar48._0_4_ + 0.5);
        bVar4 = *(byte *)(lVar3 + 0x334371 + (ulong)((uVar20 & 0x7f) << 2));
        uVar19 = uVar20 * 2 & 0x100;
        iVar63 = uVar19 + bVar4;
        uVar20 = (int)(auVar55._0_4_ + 0.5) * 2 - iVar63;
        if (0xffffff7f < uVar20 - 0x40) {
          uVar8 = uVar8 >> 1 | uVar12 & 0x7f;
          bVar13 = *(byte *)(lVar3 + 0x334371 + (ulong)uVar8 * 2);
          if ((uVar8 ^ bVar13) < 0x40) {
            uVar8 = uVar19 >> 1 | uVar20 & 0x7f;
            bVar15 = *(byte *)(lVar3 + 0x334371 + (ulong)uVar8 * 2);
            if ((((uVar8 ^ bVar15) < 0x40) &&
                ((bVar13 & 0x7f) + iVar6 + ((int)((uint)bVar13 << 0x19) >> 0x1f & 0xffffff80U) <
                 0x200)) &&
               ((bVar15 & 0x7f) + iVar63 + ((int)((uint)bVar15 << 0x19) >> 0x1f & 0xffffff80U) <
                0x200)) {
              *output = bVar5;
              output[1] = bVar13;
              output[2] = bVar4;
              output[3] = bVar15;
              return '\x05';
            }
          }
        }
      }
    }
    auVar48 = vhaddps_avx(auVar70,auVar43);
    auVar48 = vshufps_avx(auVar48,auVar48,0xe8);
    auVar55 = vunpckhps_avx(auVar70,auVar43);
    auVar29._0_4_ = (auVar55._0_4_ + auVar48._0_4_) * 0.33333334;
    auVar29._4_4_ = (auVar55._4_4_ + auVar48._4_4_) * 0.33333334;
    auVar29._8_4_ = (auVar55._8_4_ + auVar48._8_4_) * 0.33333334;
    auVar29._12_4_ = (auVar55._12_4_ + auVar48._12_4_) * 0.33333334;
    auVar48 = vshufps_avx(auVar43,auVar70,0x33);
    auVar55 = vshufps_avx(auVar48,auVar29,0x42);
    auVar30._0_4_ = (int)(auVar55._0_4_ + 0.5);
    auVar30._4_4_ = (int)(auVar55._4_4_ + 0.5);
    auVar30._8_4_ = (int)(auVar55._8_4_ + 0.5);
    auVar30._12_4_ = (int)(auVar55._12_4_ + 0.5);
    iVar6 = vextractps_avx(auVar30,3);
    auVar48 = vcvtdq2ps_avx(auVar30);
    auVar48 = vsubps_avx(auVar55,auVar48);
    auVar58._8_4_ = 0xbdcccccd;
    auVar58._0_8_ = 0xbdcccccdbdcccccd;
    auVar58._12_4_ = 0xbdcccccd;
    auVar48 = vcmpps_avx(auVar58,auVar48,2);
    uVar8 = vmovmskps_avx(auVar48);
    bVar5 = (byte)uVar8;
    iVar63 = vextractps_avx(auVar30,2);
    *output = color_unquant_to_uquant_tables[uVar18][(int)((uint)(bVar5 >> 3) + iVar6 * 2)];
    output[1] = color_unquant_to_uquant_tables[uVar18][(int)((uint)((bVar5 & 4) >> 2) + iVar63 * 2)]
    ;
    iVar6 = vextractps_avx(auVar30,1);
    output[2] = color_unquant_to_uquant_tables[uVar18][(int)((uint)((bVar5 & 2) >> 1) + iVar6 * 2)];
    output[3] = color_unquant_to_uquant_tables[uVar18][(int)((uVar8 & 1) + auVar30._0_4_ * 2)];
    uVar11 = '\x04';
    break;
  case 6:
    color_00.m[2] = (float)(int)color0_00.m._8_8_;
    color_00.m[3] = (float)(int)((ulong)color0_00.m._8_8_ >> 0x20);
    color_00.m[0] = (float)(int)auVar62._0_8_;
    color_00.m[1] = (float)(int)((ulong)auVar62._0_8_ >> 0x20);
    quantize_rgbs(color_00,output,quant_level);
    uVar11 = '\x06';
    break;
  case 7:
    auVar48 = vshufps_avx(auVar56,auVar56,0xff);
    auVar57._0_4_ = auVar48._0_4_ + color1.m[2];
    auVar57._4_4_ = auVar48._4_4_ + color1.m[3];
    auVar57._8_8_ = color1._16_8_;
    auVar55 = vshufps_avx(auVar56,auVar56,0xe9);
    auVar46._0_4_ = auVar55._0_4_ + auVar48._0_4_;
    auVar46._4_4_ = auVar55._4_4_ + auVar48._4_4_;
    auVar46._8_4_ = auVar55._8_4_ + auVar48._8_4_;
    auVar46._12_4_ = auVar55._12_4_ + auVar48._12_4_;
    auVar48 = vshufps_avx(auVar57,auVar46,0x4c);
    auVar48 = vshufps_avx(auVar48,auVar48,0x78);
    auVar48 = vmaxps_avx(auVar48,ZEXT416(0) << 0x20);
    auVar48 = vminps_avx(auVar48,auVar22);
    auVar55 = vmovshdup_avx(auVar48);
    auVar56 = vshufpd_avx(auVar48,auVar48,1);
    local_a8._8_4_ = auVar56._0_4_;
    uVar12 = (auVar55._0_4_ <= (float)local_a8._8_4_) + 1;
    uVar8 = 0;
    if (auVar48._0_4_ <= (float)local_a8._8_4_) {
      uVar8 = uVar12;
    }
    if (auVar48._0_4_ <= auVar55._0_4_) {
      uVar8 = uVar12;
    }
    if (uVar8 == 2) {
      auVar55 = vshufps_avx(auVar48,auVar48,0xc6);
    }
    else {
      auVar55 = auVar48;
      if (uVar8 == 1) {
        auVar55 = vshufps_avx(auVar48,auVar48,0xe1);
      }
    }
    auVar56 = vhsubps_avx(auVar55,auVar55);
    auVar70 = vshufpd_avx(auVar55,auVar55,1);
    fVar69 = auVar55._0_4_;
    auVar43 = vshufps_avx(auVar55,auVar55,0xff);
    auVar55 = vshufps_avx(auVar55,auVar55,0xe9);
    uVar14 = 0;
    lVar3 = (ulong)uVar18 * 0x200;
    auVar79._8_4_ = 0xffffffe0;
    auVar79._0_8_ = 0xffffffe0ffffffe0;
    auVar79._12_4_ = 0xffffffe0;
    auVar80[8] = 0x1f;
    auVar80._0_8_ = 0x1f1f1f1f1f1f1f1f;
    auVar80[9] = 0x1f;
    auVar80[10] = 0x1f;
    auVar80[0xb] = 0x1f;
    auVar80[0xc] = 0x1f;
    auVar80[0xd] = 0x1f;
    auVar80[0xe] = 0x1f;
    auVar80[0xf] = 0x1f;
    do {
      if (((auVar56._0_4_ <=
            (float)(&quantize_hdr_rgbo(vfloat4,unsigned_char*,quant_method)::mode_cutoffs)
                   [uVar14 * 2]) &&
          (fVar69 - auVar70._0_4_ <=
           (float)(&quantize_hdr_rgbo(vfloat4,unsigned_char*,quant_method)::mode_cutoffs)
                  [uVar14 * 2])) && (auVar43._0_4_ <= (float)(&DAT_003385d4)[uVar14 * 2])) {
        uVar12 = (uint)uVar14;
        uVar18 = uVar8 * 4 | uVar12;
        if (uVar14 == 4) {
          uVar18 = uVar8 | 0xc;
        }
        fVar71 = (float)(&quantize_hdr_rgbo(vfloat4,unsigned_char*,quant_method)::mode_scales)
                        [uVar14];
        fVar72 = (float)(&quantize_hdr_rgbo(vfloat4,unsigned_char*,quant_method)::mode_rscales)
                        [uVar14];
        uVar20 = (uint)(fVar71 * fVar69 + 0.5);
        uVar10 = (ulong)(uVar18 << 6 | uVar20 & 0x3f);
        do {
          bVar5 = *(byte *)(lVar3 + 0x334371 + (uVar10 & 0xff) * 2);
          uVar21 = (uint)(uVar10 & 0xff) & 0xffffffc0;
          uVar19 = bVar5 & 0xffffffc0;
          uVar10 = (ulong)(byte)((char)uVar10 - (uVar21 != uVar19));
        } while (uVar21 != uVar19);
        iVar6 = 1 << ((byte)*(undefined4 *)
                             (quantize_hdr_rgbo(vfloat4,unsigned_char*,quant_method)::mode_bits +
                             uVar14 * 0xc + 4) & 0x1f);
        fVar73 = fVar72 * (float)(int)(bVar5 & 0x3f | uVar20 & 0xffffffc0);
        auVar81._4_4_ = fVar73;
        auVar81._0_4_ = fVar73;
        auVar81._8_4_ = fVar73;
        auVar81._12_4_ = fVar73;
        auVar28 = vsubps_avx(auVar81,auVar55);
        auVar27 = vcmpps_avx(auVar22,auVar28,1);
        auVar28 = vmaxps_avx(auVar28,_DAT_0027d060);
        auVar27 = vblendvps_avx(auVar28,auVar22,auVar27);
        auVar77._0_4_ = (uint)(fVar71 * auVar27._0_4_ + 0.5);
        auVar77._4_4_ = (uint)(fVar71 * auVar27._4_4_ + 0.5);
        auVar77._8_4_ = (int)(fVar71 * auVar27._8_4_ + 0.5);
        auVar77._12_4_ = (int)(fVar71 * auVar27._12_4_ + 0.5);
        if ((iVar6 <= (int)auVar77._0_4_) || (iVar6 <= (int)auVar77._4_4_)) goto LAB_0027b5d3;
        uVar19 = 0;
        uVar21 = 0;
        if (uVar12 < 6) {
          if ((5U >> (uVar12 & 0x1f) & 1) == 0) {
            if ((10U >> (uVar12 & 0x1f) & 1) == 0) {
              uVar21 = auVar77._0_4_ >> 6;
            }
            else {
              uVar21 = uVar20 >> 8;
            }
          }
          else {
            uVar21 = uVar20 >> 9;
          }
          uVar21 = uVar21 & 1;
        }
        if (uVar12 < 4) {
          uVar19 = uVar20 >> 7;
LAB_0027b458:
          uVar19 = uVar19 & 1;
        }
        else if (uVar12 - 4 < 2) {
          uVar19 = auVar77._4_4_ >> 6;
          goto LAB_0027b458;
        }
        uVar16 = 0;
        uVar9 = 0;
        if (uVar12 < 6) {
          if ((0x3aU >> (uVar12 & 0x1f) & 1) == 0) {
            uVar9 = uVar20 >> 8;
          }
          else {
            uVar9 = auVar77._0_4_ >> 5;
          }
          uVar9 = uVar9 & 1;
        }
        switch(uVar14 & 0xffffffff) {
        case 0:
          uVar16 = uVar20 >> 10;
          break;
        case 1:
        case 3:
        case 4:
        case 5:
          uVar16 = auVar77._4_4_ >> 5;
          break;
        case 2:
          uVar16 = uVar20 >> 6;
          break;
        default:
          goto switchD_0027b498_default;
        }
        uVar16 = uVar16 & 1;
switchD_0027b498_default:
        uVar10 = (ulong)(uVar9 << 5 | uVar21 << 6 | (uVar18 & 4) << 5 | auVar77._0_4_ & 0x1f);
        do {
          bVar4 = *(byte *)(lVar3 + 0x334371 + uVar10 * 2);
          uVar21 = (uint)uVar10 & 0xfffffff0;
          uVar10 = (ulong)(byte)((char)uVar10 - (uVar21 != (bVar4 & 0xfffffff0)));
        } while (uVar21 != (bVar4 & 0xfffffff0));
        uVar10 = (ulong)(uVar16 << 5 | uVar19 << 6 | (uVar18 & 8) * 0x10 + (auVar77._4_4_ & 0x1f));
        do {
          bVar13 = *(byte *)(lVar3 + 0x334371 + (uVar10 & 0xff) * 2);
          uVar18 = (uint)(uVar10 & 0xff) & 0xfffffff0;
          uVar19 = bVar13 & 0xfffffff0;
          uVar10 = (ulong)(byte)((char)uVar10 - (uVar18 != uVar19));
        } while (uVar18 != uVar19);
        auVar28 = vpinsrb_avx(ZEXT116(bVar4),(uint)bVar13,1);
        auVar27 = vpand_avx(auVar77,auVar79);
        auVar28 = vpand_avx(auVar28,auVar80);
        auVar28 = vpmovzxbd_avx(auVar28);
        auVar27 = vpor_avx(auVar27,auVar28);
        auVar27 = vcvtdq2ps_avx(auVar27);
        auVar76._0_4_ = fVar72 * auVar27._0_4_;
        auVar76._4_4_ = fVar72 * auVar27._4_4_;
        auVar76._8_4_ = fVar72 * auVar27._8_4_;
        auVar76._12_4_ = fVar72 * auVar27._12_4_;
        auVar27 = vsubps_avx(auVar81,auVar76);
        auVar28 = vsubps_avx(auVar27,auVar55);
        auVar27 = vmovshdup_avx(auVar28);
        auVar27 = ZEXT416((uint)(auVar43._0_4_ +
                                (auVar27._0_4_ + auVar28._0_4_ + (fVar73 - fVar69)) * 0.33333334));
        auVar28 = vmaxss_avx(auVar27,ZEXT416(0));
        auVar27 = vcmpss_avx(SUB6416(ZEXT464(0x4e6e6b28),0),auVar27,1);
        auVar78._8_4_ = 0x4e6e6b28;
        auVar78._0_8_ = 0x4e6e6b284e6e6b28;
        auVar78._12_4_ = 0x4e6e6b28;
        auVar27 = vblendvps_avx(auVar28,auVar78,auVar27);
        uVar18 = (uint)(fVar71 * auVar27._0_4_ + 0.5);
        if ((int)uVar18 <
            1 << ((byte)*(undefined4 *)
                         (quantize_hdr_rgbo(vfloat4,unsigned_char*,quant_method)::mode_bits +
                         uVar14 * 0xc + 8) & 0x1f)) {
          uVar8 = uVar18 >> 5;
          if (uVar14 == 1) {
            uVar8 = uVar20 >> 9;
          }
          if (uVar12 == 1) {
            uVar12 = uVar20 >> 10;
          }
          else if (uVar12 == 4) {
            uVar12 = uVar20 >> 7;
          }
          else {
            uVar12 = uVar18 >> 6;
          }
          uVar20 = uVar20 >> 6;
          if (uVar14 == 2) {
            uVar20 = uVar18 >> 7;
          }
          uVar14 = (ulong)(uVar20 << 7 | uVar18 & 0x1f | (uVar8 & 1) << 5 | (uVar12 & 1) << 6);
          do {
            bVar15 = *(byte *)(lVar3 + 0x334371 + (uVar14 & 0xff) * 2);
            uVar18 = (uint)(uVar14 & 0xff) & 0xfffffff0;
            uVar8 = bVar15 & 0xfffffff0;
            uVar14 = (ulong)(byte)((char)uVar14 - (uVar18 != uVar8));
          } while (uVar18 != uVar8);
          *output = bVar5;
          output[1] = bVar4;
          output[2] = bVar13;
          output[3] = bVar15;
          return '\a';
        }
      }
LAB_0027b5d3:
      uVar14 = uVar14 + 1;
      if (uVar14 == 5) {
        local_a8._0_8_ = vmovlpd_avx(auVar48);
        fStack_9c = (float)vextractps_avx(auVar48,3);
        auVar50._8_4_ = 0x477dfc00;
        auVar50._0_8_ = 0x477dfc00477dfc00;
        auVar50._12_4_ = 0x477dfc00;
        auVar48 = vcmpps_avx(auVar50,(undefined1  [16])_local_a8,1);
        auVar55 = vmaxps_avx((undefined1  [16])_local_a8,ZEXT816(0) << 0x40);
        auVar55 = vblendvps_avx(auVar55,auVar50,auVar48);
        auVar48 = vmaskmovps_avx(_DAT_003384d0,auVar55);
        auVar35._0_4_ = (int)(auVar55._0_4_ * 0.001953125 + 0.5);
        auVar35._4_4_ = (int)(auVar55._4_4_ * 0.001953125 + 0.5);
        auVar35._8_4_ = (int)(auVar55._8_4_ * 0.001953125 + 0.5);
        auVar35._12_4_ = (int)(auVar55._12_4_ * 0.001953125 + 0.5);
        auVar55 = vpmaskmovd_avx2(_DAT_003384d0,auVar35);
        auVar22 = vcvtdq2ps_avx(auVar35);
        auVar36._0_4_ = auVar22._0_4_ * 512.0;
        auVar36._4_4_ = auVar22._4_4_ * 512.0;
        auVar36._8_4_ = auVar22._8_4_ * 512.0;
        auVar36._12_4_ = auVar22._12_4_ * 512.0;
        auVar22 = vmaskmovps_avx(_DAT_003384d0,auVar36);
        local_c8.m[0]._0_4_ = auVar22._0_4_;
        local_a8._0_4_ = auVar48._0_4_;
        local_c8.m._4_8_ = auVar22._4_8_;
        auVar60._8_8_ = 0;
        auVar60._0_8_ = local_c8.m._4_8_;
        local_a8._4_8_ = auVar48._4_8_;
        auVar66._8_8_ = 0;
        auVar66._0_8_ = local_a8._4_8_;
        auVar56 = vsubps_avx(auVar60,auVar66);
        auVar22 = vmovshdup_avx(auVar56);
        fStack_9c = auVar48._12_4_;
        auVar48 = ZEXT416((uint)((((float)local_c8.m[0] - (float)local_a8._0_4_) + auVar56._0_4_ +
                                 auVar22._0_4_) * 0.33333334 + fStack_9c));
        auVar22 = vmaxss_avx(auVar48,ZEXT816(0) << 0x20);
        auVar48 = vcmpss_avx(SUB6416(ZEXT464(0x477dfc00),0),auVar48,1);
        auVar48 = vblendvps_avx(auVar22,auVar50,auVar48);
        local_88.m[0]._0_4_ = auVar55._0_4_;
        local_88.m._4_8_ = auVar55._4_8_;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = local_88.m._4_8_;
        auVar55 = vpshufd_avx(auVar51,0x50);
        auVar55 = vpblendd_avx2(auVar55,ZEXT416((uint)local_88.m[0]),1);
        auVar48 = vpinsrd_avx(auVar55,(int)(auVar48._0_4_ * 0.001953125 + 0.5),3);
        auVar48 = vpand_avx(auVar48,_DAT_003384e0);
        auVar55 = vpmovzxbd_avx(ZEXT416(0x8080c0));
        auVar55 = vpinsrd_avx(auVar55,((uint)local_88.m[0] & 0x40) * 2,3);
        alVar1 = (__m128i)vpor_avx(auVar48,auVar55);
        local_b8.m[0] = alVar1[0];
        local_b8.m[1] = alVar1[1];
        lVar17 = 0;
        do {
          bVar5 = *(byte *)((long)local_b8.m + lVar17 * 4);
          do {
            bVar4 = *(byte *)(lVar3 + 0x334371 + (ulong)bVar5 * 2);
            bVar13 = bVar5 & 0xf0;
            bVar15 = bVar4 & 0xf0;
            bVar5 = bVar5 - (bVar13 != bVar15);
          } while (bVar13 != bVar15);
          output[lVar17] = bVar4;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 4);
        return '\a';
      }
    } while( true );
  case 8:
    if ((int)quant_level < 0x13) {
      color0_02.m[2] = fVar69;
      color0_02.m[3] = fVar71;
      color0_02.m[0] = fVar73;
      color0_02.m[1] = fVar74;
      bVar2 = try_quantize_rgb_delta_blue_contract
                        (color0_02,color1,(vint4 *)local_a8,&local_88,quant_level);
      if (bVar2) {
        input0.m[1] = (longlong)&local_c8;
        input0.m[0] = (longlong)&local_b8;
        input1.m[1] = (longlong)puVar7;
        input1.m[0] = extraout_RDX;
        rgba_delta_unpack(input0,input1,in_R8,in_R9);
        auVar48 = vcvtdq2ps_avx((undefined1  [16])local_b8.m);
        auVar62 = ZEXT1664(auVar43);
        auVar55 = vsubps_avx(auVar43,auVar48);
        auVar48 = vcvtdq2ps_avx((undefined1  [16])local_c8.m);
        auVar67 = ZEXT1664(auVar70);
        auVar48 = vsubps_avx(auVar70,auVar48);
        auVar25._0_4_ = auVar55._0_4_ * auVar55._0_4_ + auVar48._0_4_ * auVar48._0_4_;
        auVar25._4_4_ = auVar55._4_4_ * auVar55._4_4_ + auVar48._4_4_ * auVar48._4_4_;
        auVar25._8_4_ = auVar55._8_4_ * auVar55._8_4_ + auVar48._8_4_ * auVar48._8_4_;
        auVar25._12_4_ = auVar55._12_4_ * auVar55._12_4_ + auVar48._12_4_ * auVar48._12_4_;
        auVar48 = vshufpd_avx(auVar25,auVar25,1);
        auVar26._0_4_ = auVar25._0_4_ + auVar48._0_4_;
        auVar26._4_4_ = auVar25._4_4_ + auVar48._4_4_;
        auVar26._8_4_ = auVar25._8_4_ + auVar48._8_4_;
        auVar26._12_4_ = auVar25._12_4_ + auVar48._12_4_;
        local_98 = vhaddps_avx(auVar26,auVar26);
        uVar11 = '\t';
      }
      else {
        local_98 = SUB6416(ZEXT464(0x7149f2ca),0);
        uVar11 = '\0';
      }
      color0_09.m[2] = fVar69;
      color0_09.m[3] = fVar71;
      color0_09.m[0] = fVar73;
      color0_09.m[1] = fVar74;
      color1_05.m._0_8_ = auVar62._0_8_;
      color1_05.m._8_8_ = auVar67._0_8_;
      bVar2 = try_quantize_rgb_delta(color0_09,color1_05,&local_b8,&local_c8,quant_level);
      if (bVar2) {
        input0_03.m[1] = (longlong)local_68;
        input0_03.m[0] = (longlong)local_58;
        input1_03.m[1] = (longlong)puVar7;
        input1_03.m[0] = extraout_RDX_02;
        rgba_delta_unpack(input0_03,input1_03,in_R8,in_R9);
        auVar48 = vcvtdq2ps_avx(local_58[0]);
        auVar55 = vsubps_avx(auVar43,auVar48);
        auVar48 = vcvtdq2ps_avx(local_68);
        auVar48 = vsubps_avx(auVar70,auVar48);
        auVar37._0_4_ = auVar55._0_4_ * auVar55._0_4_ + auVar48._0_4_ * auVar48._0_4_;
        auVar37._4_4_ = auVar55._4_4_ * auVar55._4_4_ + auVar48._4_4_ * auVar48._4_4_;
        auVar37._8_4_ = auVar55._8_4_ * auVar55._8_4_ + auVar48._8_4_ * auVar48._8_4_;
        auVar37._12_4_ = auVar55._12_4_ * auVar55._12_4_ + auVar48._12_4_ * auVar48._12_4_;
        auVar48 = vshufpd_avx(auVar37,auVar37,1);
        auVar38._0_4_ = auVar37._0_4_ + auVar48._0_4_;
        auVar38._4_4_ = auVar37._4_4_ + auVar48._4_4_;
        auVar38._8_4_ = auVar37._8_4_ + auVar48._8_4_;
        auVar38._12_4_ = auVar37._12_4_ + auVar48._12_4_;
        auVar48 = vhaddps_avx(auVar38,auVar38);
        bVar2 = auVar48._0_4_ < (float)local_98._0_4_;
        if (bVar2) {
          local_a8._0_8_ = local_b8.m[0];
          stack0xffffffffffffff60 = local_b8.m[1];
          local_88.m[0] = local_c8.m[0];
          local_88.m[1] = local_c8.m[1];
          uVar11 = '\t';
          local_98 = auVar48;
        }
      }
    }
    else {
      uVar11 = '\0';
      local_98 = SUB6416(ZEXT464(0x7149f2ca),0);
    }
    if (((int)quant_level < 0x14) &&
       (color0_10.m[2] = fVar69, color0_10.m[3] = fVar71, color0_10.m[0] = fVar73,
       color0_10.m[1] = fVar74, color1_06.m._0_8_ = auVar62._0_8_, color1_06.m._8_8_ = auVar67._0_8_
       , bVar2 = try_quantize_rgb_blue_contract(color0_10,color1_06,&local_b8,&local_c8,quant_level)
       , bVar2)) {
      input0_04.m[1] = (longlong)local_68;
      input0_04.m[0] = (longlong)local_58;
      input1_04.m[1] = (longlong)puVar7;
      input1_04.m[0] = extraout_RDX_03;
      rgba_unpack(input0_04,input1_04,in_R8,in_R9);
      auVar48 = vcvtdq2ps_avx(local_58[0]);
      auVar55 = vsubps_avx(auVar43,auVar48);
      auVar48 = vcvtdq2ps_avx(local_68);
      auVar48 = vsubps_avx(auVar70,auVar48);
      auVar39._0_4_ = auVar55._0_4_ * auVar55._0_4_ + auVar48._0_4_ * auVar48._0_4_;
      auVar39._4_4_ = auVar55._4_4_ * auVar55._4_4_ + auVar48._4_4_ * auVar48._4_4_;
      auVar39._8_4_ = auVar55._8_4_ * auVar55._8_4_ + auVar48._8_4_ * auVar48._8_4_;
      auVar39._12_4_ = auVar55._12_4_ * auVar55._12_4_ + auVar48._12_4_ * auVar48._12_4_;
      auVar48 = vshufpd_avx(auVar39,auVar39,1);
      auVar40._0_4_ = auVar39._0_4_ + auVar48._0_4_;
      auVar40._4_4_ = auVar39._4_4_ + auVar48._4_4_;
      auVar40._8_4_ = auVar39._8_4_ + auVar48._8_4_;
      auVar40._12_4_ = auVar39._12_4_ + auVar48._12_4_;
      auVar48 = vhaddps_avx(auVar40,auVar40);
      bVar2 = auVar48._0_4_ < (float)local_98._0_4_;
      if (bVar2) {
        local_a8._0_8_ = local_b8.m[0];
        stack0xffffffffffffff60 = local_b8.m[1];
        local_88.m[0] = local_c8.m[0];
        local_88.m[1] = local_c8.m[1];
        uVar11 = '\b';
        local_98 = auVar48;
      }
    }
    color0_11.m[2] = fVar69;
    color0_11.m[3] = fVar71;
    color0_11.m[0] = fVar73;
    color0_11.m[1] = fVar74;
    color1_07.m._0_8_ = auVar62._0_8_;
    color1_07.m._8_8_ = auVar67._0_8_;
    quantize_rgb(color0_11,color1_07,&local_b8,&local_c8,quant_level);
    input0_05.m[1] = (longlong)local_68;
    input0_05.m[0] = (longlong)local_58;
    input1_05.m[1] = (longlong)puVar7;
    input1_05.m[0] = extraout_RDX_04;
    rgba_unpack(input0_05,input1_05,in_R8,in_R9);
    auVar48 = vcvtdq2ps_avx(local_58[0]);
    auVar55 = vsubps_avx(auVar43,auVar48);
    auVar48 = vcvtdq2ps_avx(local_68);
    auVar48 = vsubps_avx(auVar70,auVar48);
    auVar41._0_4_ = auVar55._0_4_ * auVar55._0_4_ + auVar48._0_4_ * auVar48._0_4_;
    auVar41._4_4_ = auVar55._4_4_ * auVar55._4_4_ + auVar48._4_4_ * auVar48._4_4_;
    auVar41._8_4_ = auVar55._8_4_ * auVar55._8_4_ + auVar48._8_4_ * auVar48._8_4_;
    auVar41._12_4_ = auVar55._12_4_ * auVar55._12_4_ + auVar48._12_4_ * auVar48._12_4_;
    auVar48 = vshufpd_avx(auVar41,auVar41,1);
    auVar42._0_4_ = auVar41._0_4_ + auVar48._0_4_;
    auVar42._4_4_ = auVar41._4_4_ + auVar48._4_4_;
    auVar42._8_4_ = auVar41._8_4_ + auVar48._8_4_;
    auVar42._12_4_ = auVar41._12_4_ + auVar48._12_4_;
    auVar48 = vhaddps_avx(auVar42,auVar42);
    if (auVar48._0_4_ < (float)local_98._0_4_) {
      local_a8._0_8_ = local_b8.m[0];
      stack0xffffffffffffff60 = local_b8.m[1];
      local_88.m[0] = local_c8.m[0];
      local_88.m[1] = local_c8.m[1];
      uVar11 = '\b';
    }
    *output = local_a8[0];
    output[1] = (uint8_t)local_88.m[0];
    output[2] = local_a8[4];
    output[3] = local_88.m[0]._4_1_;
    output[4] = local_a8[0];
    output[5] = (uint8_t)local_88.m[0];
    break;
  case 10:
    auVar48 = vshufpd_avx(auVar43,auVar43,1);
    auVar55 = vinsertps_avx(auVar48,auVar70,0xcc);
    iVar63 = (int)(auVar55._0_4_ + 0.5);
    iVar68 = (int)(auVar55._4_4_ + 0.5);
    auVar48 = CONCAT412((int)(auVar55._12_4_ + 0.5),
                        CONCAT48((int)(auVar55._8_4_ + 0.5),CONCAT44(iVar68,iVar63)));
    iVar6 = vextractps_avx(auVar48,1);
    auVar48 = vcvtdq2ps_avx(auVar48);
    auVar48 = vsubps_avx(auVar55,auVar48);
    auVar64._8_4_ = 0xbdcccccd;
    auVar64._0_8_ = 0xbdcccccdbdcccccd;
    auVar64._12_4_ = 0xbdcccccd;
    auVar48 = vcmpps_avx(auVar64,auVar48,2);
    auVar48 = vshufps_avx(auVar48,auVar48,0x50);
    uVar8 = vmovmskpd_avx(auVar48);
    output[4] = color_unquant_to_uquant_tables[uVar18][(int)((uVar8 >> 1 & 0x7f) + iVar6 * 2)];
    output[5] = color_unquant_to_uquant_tables[uVar18][(int)((uVar8 & 1) + iVar63 * 2)];
    color.m[2] = (float)iVar63;
    color.m[3] = (float)iVar68;
    color.m[0] = (float)(int)auVar62._0_8_;
    color.m[1] = (float)(int)((ulong)auVar62._0_8_ >> 0x20);
    quantize_rgbs(color,output,quant_level);
    uVar11 = '\n';
    break;
  case 0xb:
    color0_05.m[2] = (float)(int)color0_00.m._8_8_;
    color0_05.m[3] = (float)(int)((ulong)color0_00.m._8_8_ >> 0x20);
    color0_05.m[0] = (float)(int)color0_00.m._0_8_;
    color0_05.m[1] = (float)(int)((ulong)color0_00.m._0_8_ >> 0x20);
    quantize_hdr_rgb(color0_05,color1,output,quant_level);
    uVar11 = '\v';
    break;
  case 0xc:
    if ((int)quant_level < 0x13) {
      color0_03.m[2] = fVar69;
      color0_03.m[3] = fVar71;
      color0_03.m[0] = fVar73;
      color0_03.m[1] = fVar74;
      bVar2 = try_quantize_rgb_delta_blue_contract
                        (color0_03,color1,(vint4 *)local_a8,&local_88,quant_level);
      local_98 = SUB6416(ZEXT464(0x7149f2ca),0);
      if ((bVar2) &&
         (color0_04.m[2] = fVar73, color0_04.m[3] = fVar74, color0_04.m[0] = fVar69,
         color0_04.m[1] = fVar71, color1_01.m._0_8_ = auVar62._0_8_,
         color1_01.m._8_8_ = auVar67._0_8_,
         bVar2 = try_quantize_alpha_delta
                           (color0_04,color1_01,(vint4 *)local_a8,&local_88,quant_level), bVar2)) {
        input0_00.m[1] = (longlong)&local_c8;
        input0_00.m[0] = (longlong)&local_b8;
        input1_00.m[1] = (longlong)puVar7;
        input1_00.m[0] = extraout_RDX_00;
        rgba_delta_unpack(input0_00,input1_00,in_R8,in_R9);
        auVar48 = vcvtdq2ps_avx((undefined1  [16])local_b8.m);
        auVar62 = ZEXT1664(auVar43);
        auVar55 = vsubps_avx(auVar43,auVar48);
        auVar48 = vcvtdq2ps_avx((undefined1  [16])local_c8.m);
        auVar67 = ZEXT1664(auVar70);
        auVar48 = vsubps_avx(auVar70,auVar48);
        auVar27._0_4_ = auVar55._0_4_ * auVar55._0_4_ + auVar48._0_4_ * auVar48._0_4_;
        auVar27._4_4_ = auVar55._4_4_ * auVar55._4_4_ + auVar48._4_4_ * auVar48._4_4_;
        auVar27._8_4_ = auVar55._8_4_ * auVar55._8_4_ + auVar48._8_4_ * auVar48._8_4_;
        auVar27._12_4_ = auVar55._12_4_ * auVar55._12_4_ + auVar48._12_4_ * auVar48._12_4_;
        auVar48 = vshufpd_avx(auVar27,auVar27,1);
        auVar28._0_4_ = auVar27._0_4_ + auVar48._0_4_;
        auVar28._4_4_ = auVar27._4_4_ + auVar48._4_4_;
        auVar28._8_4_ = auVar27._8_4_ + auVar48._8_4_;
        auVar28._12_4_ = auVar27._12_4_ + auVar48._12_4_;
        local_98 = vhaddps_avx(auVar28,auVar28);
        uVar11 = '\r';
      }
      else {
        uVar11 = '\0';
      }
      color0_06.m[2] = fVar69;
      color0_06.m[3] = fVar71;
      color0_06.m[0] = fVar73;
      color0_06.m[1] = fVar74;
      color1_02.m._0_8_ = auVar62._0_8_;
      color1_02.m._8_8_ = auVar67._0_8_;
      bVar2 = try_quantize_rgb_delta(color0_06,color1_02,&local_b8,&local_c8,quant_level);
      if ((bVar2) &&
         (color0_07.m[2] = fVar69, color0_07.m[3] = fVar71, color0_07.m[0] = fVar73,
         color0_07.m[1] = fVar74, color1_03.m._0_8_ = auVar62._0_8_,
         color1_03.m._8_8_ = auVar67._0_8_,
         bVar2 = try_quantize_alpha_delta(color0_07,color1_03,&local_b8,&local_c8,quant_level),
         bVar2)) {
        input0_01.m[1] = (longlong)local_68;
        input0_01.m[0] = (longlong)local_58;
        input1_01.m[1] = (longlong)puVar7;
        input1_01.m[0] = extraout_RDX_01;
        rgba_delta_unpack(input0_01,input1_01,in_R8,in_R9);
        auVar48 = vcvtdq2ps_avx(local_58[0]);
        auVar55 = vsubps_avx(auVar43,auVar48);
        auVar48 = vcvtdq2ps_avx(local_68);
        auVar48 = vsubps_avx(auVar70,auVar48);
        auVar31._0_4_ = auVar55._0_4_ * auVar55._0_4_ + auVar48._0_4_ * auVar48._0_4_;
        auVar31._4_4_ = auVar55._4_4_ * auVar55._4_4_ + auVar48._4_4_ * auVar48._4_4_;
        auVar31._8_4_ = auVar55._8_4_ * auVar55._8_4_ + auVar48._8_4_ * auVar48._8_4_;
        auVar31._12_4_ = auVar55._12_4_ * auVar55._12_4_ + auVar48._12_4_ * auVar48._12_4_;
        auVar48 = vshufpd_avx(auVar31,auVar31,1);
        auVar32._0_4_ = auVar31._0_4_ + auVar48._0_4_;
        auVar32._4_4_ = auVar31._4_4_ + auVar48._4_4_;
        auVar32._8_4_ = auVar31._8_4_ + auVar48._8_4_;
        auVar32._12_4_ = auVar31._12_4_ + auVar48._12_4_;
        auVar48 = vhaddps_avx(auVar32,auVar32);
        bVar2 = auVar48._0_4_ < (float)local_98._0_4_;
        if (bVar2) {
          local_a8._0_8_ = local_b8.m[0];
          stack0xffffffffffffff60 = local_b8.m[1];
          local_88.m[0] = local_c8.m[0];
          local_88.m[1] = local_c8.m[1];
          uVar11 = '\r';
          local_98 = auVar48;
        }
      }
    }
    else {
      uVar11 = '\0';
      local_98 = SUB6416(ZEXT464(0x7149f2ca),0);
    }
    if (((int)quant_level < 0x14) &&
       (color0_08.m[2] = fVar69, color0_08.m[3] = fVar71, color0_08.m[0] = fVar73,
       color0_08.m[1] = fVar74, color1_04.m._0_8_ = auVar62._0_8_, color1_04.m._8_8_ = auVar67._0_8_
       , bVar2 = try_quantize_rgb_blue_contract(color0_08,color1_04,&local_b8,&local_c8,quant_level)
       , bVar2)) {
      auVar48 = vpermilpd_avx(auVar70,1);
      auVar55 = vinsertps_avx(auVar48,ZEXT416((uint)fVar75),0xc);
      auVar49._0_4_ = (int)(auVar55._0_4_ + 0.5);
      auVar49._4_4_ = (int)(auVar55._4_4_ + 0.5);
      auVar49._8_4_ = (int)(auVar55._8_4_ + 0.5);
      auVar49._12_4_ = (int)(auVar55._12_4_ + 0.5);
      iVar6 = vextractps_avx(auVar49,1);
      auVar48 = vcvtdq2ps_avx(auVar49);
      auVar48 = vsubps_avx(auVar55,auVar48);
      auVar59._8_4_ = 0xbdcccccd;
      auVar59._0_8_ = 0xbdcccccdbdcccccd;
      auVar59._12_4_ = 0xbdcccccd;
      auVar62 = ZEXT1664(auVar59);
      auVar48 = vcmpps_avx(auVar59,auVar48,2);
      auVar48 = vshufps_avx(auVar48,auVar48,0x50);
      uVar8 = vmovmskpd_avx(auVar48);
      local_b8.m[1]._4_1_ =
           color_unquant_to_uquant_tables[uVar18][(int)((uVar8 >> 1 & 0x7f) + iVar6 * 2)];
      local_b8.m[1]._5_3_ = 0;
      input1_02.m[0] = (ulong)(uVar8 & 1);
      input1_02.m[1] = (long)(int)((uVar8 & 1) + auVar49._0_4_ * 2);
      bVar5 = color_unquant_to_uquant_tables[uVar18][input1_02.m[1]];
      vpinsrd_avx((undefined1  [16])local_c8.m,(uint)bVar5,3);
      local_c8.m[1]._4_1_ = bVar5;
      local_c8.m[1]._5_3_ = 0;
      input0_02.m[1] = (longlong)local_68;
      input0_02.m[0] = (longlong)local_58;
      rgba_unpack(input0_02,input1_02,in_R8,in_R9);
      auVar48 = vcvtdq2ps_avx(local_58[0]);
      auVar55 = vsubps_avx(auVar43,auVar48);
      auVar48 = vcvtdq2ps_avx(local_68);
      auVar48 = vsubps_avx(auVar70,auVar48);
      auVar33._0_4_ = auVar55._0_4_ * auVar55._0_4_ + auVar48._0_4_ * auVar48._0_4_;
      auVar33._4_4_ = auVar55._4_4_ * auVar55._4_4_ + auVar48._4_4_ * auVar48._4_4_;
      auVar33._8_4_ = auVar55._8_4_ * auVar55._8_4_ + auVar48._8_4_ * auVar48._8_4_;
      auVar33._12_4_ = auVar55._12_4_ * auVar55._12_4_ + auVar48._12_4_ * auVar48._12_4_;
      auVar48 = vshufpd_avx(auVar33,auVar33,1);
      auVar34._0_4_ = auVar33._0_4_ + auVar48._0_4_;
      auVar34._4_4_ = auVar33._4_4_ + auVar48._4_4_;
      auVar34._8_4_ = auVar33._8_4_ + auVar48._8_4_;
      auVar34._12_4_ = auVar33._12_4_ + auVar48._12_4_;
      auVar48 = vhaddps_avx(auVar34,auVar34);
      bVar2 = auVar48._0_4_ < (float)local_98._0_4_;
      if (bVar2) {
        local_a8._0_8_ = local_b8.m[0];
        stack0xffffffffffffff60 = local_b8.m[1];
        local_88.m[0] = local_c8.m[0];
        local_88.m[1] = local_c8.m[1];
        uVar11 = '\f';
        local_98 = auVar48;
      }
    }
    color0_12.m[2] = fVar69;
    color0_12.m[3] = fVar71;
    color0_12.m[0] = fVar73;
    color0_12.m[1] = fVar74;
    color1_08.m._0_8_ = auVar62._0_8_;
    color1_08.m._8_8_ = auVar67._0_8_;
    quantize_rgb(color0_12,color1_08,&local_b8,&local_c8,quant_level);
    auVar48 = vpermilpd_avx(auVar43,1);
    auVar55 = vinsertps_avx(auVar48,ZEXT416((uint)fVar72),0xc);
    auVar52._0_4_ = (int)(auVar55._0_4_ + 0.5);
    auVar52._4_4_ = (int)(auVar55._4_4_ + 0.5);
    auVar52._8_4_ = (int)(auVar55._8_4_ + 0.5);
    auVar52._12_4_ = (int)(auVar55._12_4_ + 0.5);
    iVar6 = vextractps_avx(auVar52,1);
    auVar48 = vcvtdq2ps_avx(auVar52);
    auVar48 = vsubps_avx(auVar55,auVar48);
    auVar61._8_4_ = 0xbdcccccd;
    auVar61._0_8_ = 0xbdcccccdbdcccccd;
    auVar61._12_4_ = 0xbdcccccd;
    auVar48 = vcmpps_avx(auVar61,auVar48,2);
    auVar48 = vshufps_avx(auVar48,auVar48,0x50);
    uVar8 = vmovmskpd_avx(auVar48);
    local_b8.m[1]._4_1_ =
         color_unquant_to_uquant_tables[uVar18][(int)((uVar8 >> 1 & 0x7f) + iVar6 * 2)];
    local_b8.m[1]._5_3_ = 0;
    input1_06.m[0] = (ulong)(uVar8 & 1);
    input1_06.m[1] = (long)(int)((uVar8 & 1) + auVar52._0_4_ * 2);
    bVar5 = color_unquant_to_uquant_tables[uVar18][input1_06.m[1]];
    vpinsrd_avx((undefined1  [16])local_c8.m,(uint)bVar5,3);
    local_c8.m[1]._4_1_ = bVar5;
    local_c8.m[1]._5_3_ = 0;
    input0_06.m[1] = (longlong)local_68;
    input0_06.m[0] = (longlong)local_58;
    rgba_unpack(input0_06,input1_06,in_R8,in_R9);
    auVar48 = vcvtdq2ps_avx(local_58[0]);
    auVar55 = vsubps_avx(auVar43,auVar48);
    auVar48 = vcvtdq2ps_avx(local_68);
    auVar48 = vsubps_avx(auVar70,auVar48);
    auVar43._0_4_ = auVar55._0_4_ * auVar55._0_4_ + auVar48._0_4_ * auVar48._0_4_;
    auVar43._4_4_ = auVar55._4_4_ * auVar55._4_4_ + auVar48._4_4_ * auVar48._4_4_;
    auVar43._8_4_ = auVar55._8_4_ * auVar55._8_4_ + auVar48._8_4_ * auVar48._8_4_;
    auVar43._12_4_ = auVar55._12_4_ * auVar55._12_4_ + auVar48._12_4_ * auVar48._12_4_;
    auVar48 = vshufpd_avx(auVar43,auVar43,1);
    auVar44._0_4_ = auVar43._0_4_ + auVar48._0_4_;
    auVar44._4_4_ = auVar43._4_4_ + auVar48._4_4_;
    auVar44._8_4_ = auVar43._8_4_ + auVar48._8_4_;
    auVar44._12_4_ = auVar43._12_4_ + auVar48._12_4_;
    auVar48 = vhaddps_avx(auVar44,auVar44);
    if (auVar48._0_4_ < (float)local_98._0_4_) {
      local_a8._0_8_ = local_b8.m[0];
      stack0xffffffffffffff60 = local_b8.m[1];
      local_88.m[0] = local_c8.m[0];
      local_88.m[1] = local_c8.m[1];
      uVar11 = '\f';
    }
    *output = local_a8[0];
    output[1] = (uint8_t)local_88.m[0];
    output[2] = local_a8[4];
    output[3] = local_88.m[0]._4_1_;
    output[4] = local_a8[0];
    output[5] = (uint8_t)local_88.m[0];
    output[6] = local_a8[4];
    output[7] = local_88.m[0]._4_1_;
    break;
  case 0xe:
    auVar55 = vshufpd_avx(auVar55,auVar55,1);
    auVar48 = vinsertps_avx(auVar55,auVar48,0xcc);
    auVar55._0_4_ = auVar48._0_4_ * 0.0038910506;
    auVar55._4_4_ = auVar48._4_4_ * 0.0038910506;
    auVar55._8_4_ = auVar48._8_4_ * 0.0038910506;
    auVar55._12_4_ = auVar48._12_4_ * 0.0038910506;
    auVar70._8_4_ = 0x437f0000;
    auVar70._0_8_ = 0x437f0000437f0000;
    auVar70._12_4_ = 0x437f0000;
    auVar48 = vcmpps_avx(auVar70,auVar55,1);
    auVar55 = vmaxps_avx(auVar55,ZEXT816(0));
    auVar48 = vblendvps_avx(auVar55,auVar70,auVar48);
    iVar63 = (int)(auVar48._0_4_ + 0.5);
    iVar68 = (int)(auVar48._4_4_ + 0.5);
    auVar55 = CONCAT412((int)(auVar48._12_4_ + 0.5),
                        CONCAT48((int)(auVar48._8_4_ + 0.5),CONCAT44(iVar68,iVar63)));
    iVar6 = vextractps_avx(auVar55,1);
    auVar55 = vcvtdq2ps_avx(auVar55);
    auVar48 = vsubps_avx(auVar48,auVar55);
    auVar56._8_4_ = 0xbdcccccd;
    auVar56._0_8_ = 0xbdcccccdbdcccccd;
    auVar56._12_4_ = 0xbdcccccd;
    auVar48 = vcmpps_avx(auVar56,auVar48,2);
    auVar48 = vshufps_avx(auVar48,auVar48,0x50);
    uVar8 = vmovmskpd_avx(auVar48);
    output[6] = color_unquant_to_uquant_tables[uVar18][(int)((uVar8 >> 1 & 0x7f) + iVar6 * 2)];
    output[7] = color_unquant_to_uquant_tables[uVar18][(int)((uVar8 & 1) + iVar63 * 2)];
    color1_00.m[2] = (float)iVar63;
    color1_00.m[3] = (float)iVar68;
    color1_00.m[0] = -0.1;
    color1_00.m[1] = -0.1;
    quantize_hdr_rgb(color0_00,color1_00,output,quant_level);
    uVar11 = '\x0e';
    break;
  case 0xf:
    color0_01.m[2] = (float)(int)color0_00.m._8_8_;
    color0_01.m[3] = (float)(int)((ulong)color0_00.m._8_8_ >> 0x20);
    color0_01.m[0] = (float)(int)color0_00.m._0_8_;
    color0_01.m[1] = (float)(int)((ulong)color0_00.m._0_8_ >> 0x20);
    local_78 = output;
    quantize_hdr_rgb(color0_01,color1,output,quant_level);
    auVar55 = vpermilps_avx(auVar55,0xff);
    auVar22 = vmaxss_avx(auVar55,ZEXT816(0) << 0x40);
    auVar55 = vcmpss_avx(SUB6416(ZEXT464(0x477f0000),0),auVar55,1);
    auVar55 = vblendvps_avx(ZEXT416((uint)(auVar22._0_4_ + 0.5)),SUB6416(ZEXT464(0x477f0080),0),
                            auVar55);
    auVar48 = vpermilps_avx(auVar48,0xff);
    auVar22 = vmaxss_avx(auVar48,ZEXT816(0) << 0x40);
    auVar48 = vcmpss_avx(SUB6416(ZEXT464(0x477f0000),0),auVar48,1);
    auVar48 = vblendvps_avx(ZEXT416((uint)(auVar22._0_4_ + 0.5)),SUB6416(ZEXT464(0x477f0080),0),
                            auVar48);
    uVar14 = (ulong)uVar18;
    lVar3 = 2;
    lVar17 = -3;
    uVar18 = 0;
    uVar8 = 0x80;
    do {
      uVar20 = 0x80 >> ((byte)lVar3 & 0x1f);
      bVar4 = (char)lVar17 + 9;
      uVar12 = (int)(uVar20 + (int)auVar55._0_4_) >> (bVar4 & 0x1f);
      bVar5 = *(byte *)(uVar14 * 0x200 + 0x334371 + (ulong)(uVar18 & 0x80 | uVar12 & 0x7f) * 2);
      if (-1 < (char)((byte)uVar18 ^ bVar5)) {
        uVar19 = 0x20 >> ((byte)lVar3 & 0x1f);
        uVar20 = ((int)(uVar20 + (int)auVar48._0_4_) >> (bVar4 & 0x1f)) -
                 (bVar5 & 0x7f | uVar12 & 0xffffff80);
        if (((int)uVar20 < (int)uVar19 && SBORROW4(uVar20,-uVar19) == (int)(uVar20 + uVar19) < 0) &&
           (uVar12 = uVar20 & uVar19 * 2 - 1 |
                     ((int)uVar12 >> 7) << ((char)lVar17 + 7U & 0x1f) | uVar8 & 0x80,
           bVar4 = color_unquant_to_uquant_tables[uVar14][(int)(uVar12 * 2 + 1)],
           (*(uint *)(quantize_hdr_alpha(float,float,unsigned_char*,quant_method)::testbits +
                     lVar3 * 4) & (uVar12 ^ bVar4)) == 0)) {
          local_78[6] = bVar5;
          local_78[7] = bVar4;
          goto LAB_0027bb79;
        }
      }
      lVar3 = lVar3 + -1;
      uVar18 = uVar18 - 0x80;
      uVar8 = uVar8 - 0x40;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 0);
    local_78[6] = color_unquant_to_uquant_tables[uVar14]
                  [(int)((int)auVar55._0_4_ + 0x100 >> 8 | 0x101)];
    local_78[7] = color_unquant_to_uquant_tables[uVar14]
                  [(int)((int)auVar48._0_4_ + 0x100 >> 8 | 0x101)];
LAB_0027bb79:
    uVar11 = '\x0f';
  }
  return uVar11;
}

Assistant:

uint8_t pack_color_endpoints(
	vfloat4 color0,
	vfloat4 color1,
	vfloat4 rgbs_color,
	vfloat4 rgbo_color,
	int format,
	uint8_t* output,
	quant_method quant_level
) {
	assert(QUANT_6 <= quant_level && quant_level <= QUANT_256);

	// Clamp colors to a valid LDR range
	// Note that HDR has a lower max, handled in the conversion functions
	color0 = clamp(0.0f, 65535.0f, color0);
	color1 = clamp(0.0f, 65535.0f, color1);

	// Pre-scale the LDR value we need to the 0-255 quantizable range
	vfloat4 color0_ldr = color0 * (1.0f  / 257.0f);
	vfloat4 color1_ldr = color1 * (1.0f  / 257.0f);

	uint8_t retval = 0;
	float best_error = ERROR_CALC_DEFAULT;
	vint4 color0_out, color1_out;
	vint4 color0_out2, color1_out2;

	switch (format)
	{
	case FMT_RGB:
		if (quant_level <= QUANT_160)
		{
			if (try_quantize_rgb_delta_blue_contract(color0_ldr, color1_ldr, color0_out, color1_out, quant_level))
			{
				vint4 color0_unpack;
				vint4 color1_unpack;
				rgba_delta_unpack(color0_out, color1_out, color0_unpack, color1_unpack);

				retval = FMT_RGB_DELTA;
				best_error = get_rgba_encoding_error(color0_ldr, color1_ldr, color0_unpack, color1_unpack);
			}

			if (try_quantize_rgb_delta(color0_ldr, color1_ldr, color0_out2, color1_out2, quant_level))
			{
				vint4 color0_unpack;
				vint4 color1_unpack;
				rgba_delta_unpack(color0_out2, color1_out2, color0_unpack, color1_unpack);

				float error = get_rgba_encoding_error(color0_ldr, color1_ldr, color0_unpack, color1_unpack);
				if (error < best_error)
				{
					retval = FMT_RGB_DELTA;
					best_error = error;
					color0_out = color0_out2;
					color1_out = color1_out2;
				}
			}
		}

		if (quant_level < QUANT_256)
		{
			if (try_quantize_rgb_blue_contract(color0_ldr, color1_ldr, color0_out2, color1_out2, quant_level))
			{
				vint4 color0_unpack;
				vint4 color1_unpack;
				rgba_unpack(color0_out2, color1_out2, color0_unpack, color1_unpack);

				float error = get_rgba_encoding_error(color0_ldr, color1_ldr, color0_unpack, color1_unpack);
				if (error < best_error)
				{
					retval = FMT_RGB;
					best_error = error;
					color0_out = color0_out2;
					color1_out = color1_out2;
				}
			}
		}

		{
			quantize_rgb(color0_ldr, color1_ldr, color0_out2, color1_out2, quant_level);

			vint4 color0_unpack;
			vint4 color1_unpack;
			rgba_unpack(color0_out2, color1_out2, color0_unpack, color1_unpack);

			float error = get_rgba_encoding_error(color0_ldr, color1_ldr, color0_unpack, color1_unpack);
			if (error < best_error)
			{
				retval =  FMT_RGB;
				color0_out = color0_out2;
				color1_out = color1_out2;
			}
		}

		// TODO: Can we vectorize this?
		output[0] = static_cast<uint8_t>(color0_out.lane<0>());
		output[1] = static_cast<uint8_t>(color1_out.lane<0>());
		output[2] = static_cast<uint8_t>(color0_out.lane<1>());
		output[3] = static_cast<uint8_t>(color1_out.lane<1>());
		output[4] = static_cast<uint8_t>(color0_out.lane<2>());
		output[5] = static_cast<uint8_t>(color1_out.lane<2>());
		break;

	case FMT_RGBA:
		if (quant_level <= QUANT_160)
		{
			if (try_quantize_rgba_delta_blue_contract(color0_ldr, color1_ldr, color0_out, color1_out, quant_level))
			{
				vint4 color0_unpack;
				vint4 color1_unpack;
				rgba_delta_unpack(color0_out, color1_out, color0_unpack, color1_unpack);

				retval = FMT_RGBA_DELTA;
				best_error = get_rgba_encoding_error(color0_ldr, color1_ldr, color0_unpack, color1_unpack);
			}

			if (try_quantize_rgba_delta(color0_ldr, color1_ldr, color0_out2, color1_out2, quant_level))
			{
				vint4 color0_unpack;
				vint4 color1_unpack;
				rgba_delta_unpack(color0_out2, color1_out2, color0_unpack, color1_unpack);

				float error = get_rgba_encoding_error(color0_ldr, color1_ldr, color0_unpack, color1_unpack);
				if (error < best_error)
				{
					retval = FMT_RGBA_DELTA;
					best_error = error;
					color0_out = color0_out2;
					color1_out = color1_out2;
				}
			}
		}

		if (quant_level < QUANT_256)
		{
			if (try_quantize_rgba_blue_contract(color0_ldr, color1_ldr, color0_out2, color1_out2, quant_level))
			{
				vint4 color0_unpack;
				vint4 color1_unpack;
				rgba_unpack(color0_out2, color1_out2, color0_unpack, color1_unpack);

				float error = get_rgba_encoding_error(color0_ldr, color1_ldr, color0_unpack, color1_unpack);
				if (error < best_error)
				{
					retval = FMT_RGBA;
					best_error = error;
					color0_out = color0_out2;
					color1_out = color1_out2;
				}
			}
		}

		{
			quantize_rgba(color0_ldr, color1_ldr, color0_out2, color1_out2, quant_level);

			vint4 color0_unpack;
			vint4 color1_unpack;
			rgba_unpack(color0_out2, color1_out2, color0_unpack, color1_unpack);

			float error = get_rgba_encoding_error(color0_ldr, color1_ldr, color0_unpack, color1_unpack);
			if (error < best_error)
			{
				retval =  FMT_RGBA;
				color0_out = color0_out2;
				color1_out = color1_out2;
			}
		}

		// TODO: Can we vectorize this?
		output[0] = static_cast<uint8_t>(color0_out.lane<0>());
		output[1] = static_cast<uint8_t>(color1_out.lane<0>());
		output[2] = static_cast<uint8_t>(color0_out.lane<1>());
		output[3] = static_cast<uint8_t>(color1_out.lane<1>());
		output[4] = static_cast<uint8_t>(color0_out.lane<2>());
		output[5] = static_cast<uint8_t>(color1_out.lane<2>());
		output[6] = static_cast<uint8_t>(color0_out.lane<3>());
		output[7] = static_cast<uint8_t>(color1_out.lane<3>());
		break;

	case FMT_RGB_SCALE:
		quantize_rgbs(rgbs_color, output, quant_level);
		retval = FMT_RGB_SCALE;
		break;

	case FMT_HDR_RGB_SCALE:
		quantize_hdr_rgbo(rgbo_color, output, quant_level);
		retval = FMT_HDR_RGB_SCALE;
		break;

	case FMT_HDR_RGB:
		quantize_hdr_rgb(color0, color1, output, quant_level);
		retval = FMT_HDR_RGB;
		break;

	case FMT_RGB_SCALE_ALPHA:
		quantize_rgbs_alpha(color0_ldr, color1_ldr, rgbs_color, output, quant_level);
		retval = FMT_RGB_SCALE_ALPHA;
		break;

	case FMT_HDR_LUMINANCE_SMALL_RANGE:
	case FMT_HDR_LUMINANCE_LARGE_RANGE:
		if (try_quantize_hdr_luminance_small_range(color0, color1, output, quant_level))
		{
			retval = FMT_HDR_LUMINANCE_SMALL_RANGE;
			break;
		}
		quantize_hdr_luminance_large_range(color0, color1, output, quant_level);
		retval = FMT_HDR_LUMINANCE_LARGE_RANGE;
		break;

	case FMT_LUMINANCE:
		quantize_luminance(color0_ldr, color1_ldr, output, quant_level);
		retval = FMT_LUMINANCE;
		break;

	case FMT_LUMINANCE_ALPHA:
		if (quant_level <= 18)
		{
			if (try_quantize_luminance_alpha_delta(color0_ldr, color1_ldr, output, quant_level))
			{
				retval = FMT_LUMINANCE_ALPHA_DELTA;
				break;
			}
		}
		quantize_luminance_alpha(color0_ldr, color1_ldr, output, quant_level);
		retval = FMT_LUMINANCE_ALPHA;
		break;

	case FMT_HDR_RGB_LDR_ALPHA:
		quantize_hdr_rgb_ldr_alpha(color0, color1, output, quant_level);
		retval = FMT_HDR_RGB_LDR_ALPHA;
		break;

	case FMT_HDR_RGBA:
		quantize_hdr_rgb_alpha(color0, color1, output, quant_level);
		retval = FMT_HDR_RGBA;
		break;
	}

	return retval;
}